

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O1

void __thiscall
google::
dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
::dense_hashtable(dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                  *this,size_type expected_max_items_in_table,Hasher *hf,Hasher *eql,Identity *ext,
                 SetKey *set,Alloc<const_char_*,_unsigned_long,_18446744073709551615UL> *alloc)

{
  int *piVar1;
  int iVar2;
  undefined4 uVar3;
  ulong uVar4;
  ulong uVar5;
  float fVar6;
  
  (this->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.super_Hasher.
  num_compares_ = hf->num_compares_;
  iVar2 = hf->num_hashes_;
  (this->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.super_Hasher.
  id_ = hf->id_;
  (this->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.super_Hasher.
  num_hashes_ = iVar2;
  (this->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
  consider_shrink_ = false;
  (this->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.use_empty_ =
       false;
  (this->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.use_deleted_
       = false;
  (this->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
  num_ht_copies_ = 0;
  (this->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
  enlarge_threshold_ = 0;
  (this->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
  shrink_threshold_ = 0;
  (this->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
  enlarge_factor_ = 0.5;
  (this->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
  shrink_factor_ = 0.2;
  iVar2 = eql->num_hashes_;
  (this->key_info).super_Hasher.id_ = eql->id_;
  (this->key_info).super_Hasher.num_hashes_ = iVar2;
  (this->key_info).super_Hasher.num_compares_ = eql->num_compares_;
  (this->key_info).delkey = (type)0x0;
  (this->key_info).empty_key = (type)0x0;
  this->num_deleted = 0;
  this->num_elements = 0;
  if (expected_max_items_in_table == 0) {
    uVar4 = 0x20;
  }
  else {
    uVar4 = sparsehash_internal::sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>::
            min_buckets((sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4> *)this,
                        expected_max_items_in_table,0);
  }
  this->num_buckets = uVar4;
  uVar3 = *(undefined4 *)&alloc->field_0x4;
  piVar1 = alloc->count_;
  (this->val_info).super_alloc_impl<Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>.
  super_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>.id_ = alloc->id_;
  *(undefined4 *)
   &(this->val_info).super_alloc_impl<Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>.
    super_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>.field_0x4 = uVar3;
  (this->val_info).super_alloc_impl<Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>.
  super_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>.count_ = piVar1;
  this->table = (pointer)0x0;
  fVar6 = (this->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
          enlarge_factor_ * (float)uVar4;
  uVar5 = (ulong)fVar6;
  (this->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
  enlarge_threshold_ = (long)(fVar6 - 9.223372e+18) & (long)uVar5 >> 0x3f | uVar5;
  fVar6 = (float)uVar4 *
          (this->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
          shrink_factor_;
  uVar4 = (ulong)fVar6;
  (this->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
  shrink_threshold_ = (long)(fVar6 - 9.223372e+18) & (long)uVar4 >> 0x3f | uVar4;
  (this->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
  consider_shrink_ = false;
  return;
}

Assistant:

explicit dense_hashtable(size_type expected_max_items_in_table = 0,
                           const HashFcn& hf = HashFcn(),
                           const EqualKey& eql = EqualKey(),
                           const ExtractKey& ext = ExtractKey(),
                           const SetKey& set = SetKey(),
                           const Alloc& alloc = Alloc())
      : settings(hf),
        key_info(ext, set, eql),
        num_deleted(0),
        num_elements(0),
        num_buckets(expected_max_items_in_table == 0
                        ? HT_DEFAULT_STARTING_BUCKETS
                        : settings.min_buckets(expected_max_items_in_table, 0)),
        val_info(alloc_impl<value_alloc_type>(alloc)),
        table(NULL) {
    // table is NULL until emptyval is set.  However, we set num_buckets
    // here so we know how much space to allocate once emptyval is set
    settings.reset_thresholds(bucket_count());
  }